

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<int,(unsigned_char)4>>(Thread *this)

{
  int *piVar1;
  byte local_25;
  uint local_24;
  undefined1 auStack_20 [3];
  u8 i;
  u32 result;
  Simd<int,_(unsigned_char)__x04_> val;
  Thread *this_local;
  
  val.v._8_8_ = this;
  _auStack_20 = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  local_24 = 0;
  for (local_25 = 0; local_25 < 4; local_25 = local_25 + 1) {
    piVar1 = Simd<int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<int,_(unsigned_char)__x04_> *)auStack_20,local_25);
    if (*piVar1 < 0) {
      local_24 = 1 << (local_25 & 0x1f) | local_24;
    }
  }
  Push<unsigned_int>(this,local_24);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}